

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.h
# Opt level: O0

void __thiscall Assimp::Blender::Scene::Scene(Scene *this)

{
  Scene *this_local;
  
  ElemBase::ElemBase(&this->super_ElemBase);
  (this->super_ElemBase)._vptr_ElemBase = (_func_int **)&PTR__Scene_00f41d40;
  ID::ID(&this->id);
  ::std::shared_ptr<Assimp::Blender::Object>::shared_ptr(&this->camera);
  ::std::shared_ptr<Assimp::Blender::World>::shared_ptr(&this->world);
  ::std::shared_ptr<Assimp::Blender::Base>::shared_ptr(&this->basact);
  ListBase::ListBase(&this->base);
  return;
}

Assistant:

Scene()
    : ElemBase()
    , camera()
    , world()
    , basact() {
        // empty
    }